

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imapControl.cc
# Opt level: O2

int __thiscall imapControl::parseEmail(imapControl *this)

{
  int iVar1;
  cmatch matches;
  string local_70;
  string substring;
  regex commandPat;
  
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&commandPat,"COMMAND_STREAM .((( 0?x?[0-9,a-f,A-F]{2},?)){5,1024})",0x10);
  matches.
  super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  matches._M_begin = (char *)0x0;
  matches.
  super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  matches.
  super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  regex_search<char,std::allocator<std::__cxx11::sub_match<char_const*>>,std::__cxx11::regex_traits<char>>
            ((this->bufferInfo).buffer,&matches,&commandPat,0);
  if ((ulong)(((long)matches.
                     super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                     .
                     super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)matches.
                    super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x18) < 4) {
    fwrite("Skipping email with no apparent command message\n",0x30,1,_stdout);
    iVar1 = 0;
  }
  else {
    std::__cxx11::
    match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::str
              (&substring,&matches,1);
    std::__cxx11::string::string((string *)&local_70,(string *)&substring);
    iVar1 = verifyPattern(this,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&substring);
  }
  std::
  _Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ::~_Vector_base((_Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                   *)&matches);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&commandPat);
  return iVar1;
}

Assistant:

int imapControl::parseEmail() {
  int returnCode = 2;  // default to stop processing
  std::regex commandPat(COMMAND_PATTERN);
  std::cmatch matches;
  std::regex_search(bufferInfo.buffer, matches, commandPat);
  if (!matches.empty()) {
    std::string substring = matches.str(1);  // get digits following text
    returnCode = verifyPattern(substring);
  } else {
    fprintf(stdout, "Skipping email with no apparent command message\n");
    returnCode = 0;
  }
  return returnCode;  // 2 - not ok, stop; 1 - ok process; 0 - ok continue
}